

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_wnaf_fixed(int *wnaf,secp256k1_scalar *s,int w)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (((s->d[1] == 0 && s->d[2] == 0) && s->d[3] == 0) && s->d[0] == 0) {
    uVar6 = 0;
    if (-1 < (int)(0x7f / (long)w)) {
      uVar6 = 0;
      memset(wnaf,0,(0x7f / (long)w & 0xffffffffU) * 4 + 4);
    }
  }
  else {
    uVar9 = (uint)s->d[0];
    uVar6 = ~uVar9 & 1;
    bVar4 = (byte)w;
    *wnaf = ((uVar9 << (-bVar4 & 0x1f)) >> (-bVar4 & 0x1f)) + uVar6;
    uVar7 = 0x7f / (long)w;
    uVar3 = uVar7 & 0xffffffff;
    iVar10 = 0x80 - (int)uVar7 * w;
    uVar14 = uVar7 & 0xffffffff;
    uVar8 = (ulong)(uint)w;
    if (0 < (int)uVar7) {
      uVar7 = uVar14 * uVar8;
      lVar11 = 0;
      uVar3 = uVar14;
      do {
        iVar1 = w;
        if (lVar11 == 0) {
          iVar1 = iVar10;
        }
        uVar12 = uVar7 >> 6 & 0x3ffffff;
        bVar5 = (byte)uVar7 & 0x3f;
        if ((iVar1 + (int)uVar7) - 1U >> 6 == (uint)uVar12) {
          uVar9 = (uint)(s->d[uVar12] >> bVar5);
        }
        else {
          uVar9 = (uint)(s->d[uVar12] >> ((byte)uVar7 & 0x3f)) |
                  (uint)(s->d[uVar12 + 1] << (-bVar5 & 0x3f));
        }
        if (uVar9 << (-(char)iVar1 & 0x1fU) != 0) goto LAB_0016a6f2;
        wnaf[uVar3] = 0;
        lVar11 = lVar11 + 1;
        uVar7 = uVar7 - uVar8;
        bVar2 = 1 < (long)uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar2);
      uVar3 = 0;
    }
LAB_0016a6f2:
    if (0 < (int)uVar3) {
      uVar12 = 1;
      uVar7 = uVar8;
      do {
        iVar1 = w;
        if (uVar14 == uVar12) {
          iVar1 = iVar10;
        }
        uVar13 = uVar7 >> 6 & 0x3ffffff;
        bVar5 = (byte)uVar7 & 0x3f;
        if (((int)uVar7 + iVar1) - 1U >> 6 == (uint)uVar13) {
          uVar13 = s->d[uVar13] >> bVar5;
        }
        else {
          uVar13 = s->d[uVar13] >> ((byte)uVar7 & 0x3f) | s->d[uVar13 + 1] << (-bVar5 & 0x3f);
        }
        uVar9 = (uint)((int)uVar13 << (-(char)iVar1 & 0x1fU)) >> (-(char)iVar1 & 0x1fU);
        if ((uVar13 & 1) == 0) {
          wnaf[uVar12 - 1] = wnaf[uVar12 - 1] + (-1 << (bVar4 & 0x1f));
          uVar9 = uVar9 | 1;
        }
        wnaf[uVar12] = uVar9;
        if ((1 < uVar12) &&
           (((iVar1 = wnaf[uVar12 - 1], iVar1 == 1 && (wnaf[uVar12 - 2] < 0)) ||
            ((iVar1 == -1 && (0 < wnaf[uVar12 - 2])))))) {
          wnaf[uVar12 - 2] = wnaf[uVar12 - 2] + ((uint)(iVar1 == 1) * 2 + -1 << (bVar4 & 0x1f));
          wnaf[uVar12 - 1] = 0;
        }
        uVar12 = uVar12 + 1;
        uVar7 = uVar7 + uVar8;
      } while ((int)uVar3 + 1 != uVar12);
    }
  }
  return uVar6;
}

Assistant:

static int secp256k1_wnaf_fixed(int *wnaf, const secp256k1_scalar *s, int w) {
    int skew = 0;
    int pos;
    int max_pos;
    int last_w;
    const secp256k1_scalar *work = s;

    if (secp256k1_scalar_is_zero(s)) {
        for (pos = 0; pos < WNAF_SIZE(w); pos++) {
            wnaf[pos] = 0;
        }
        return 0;
    }

    if (secp256k1_scalar_is_even(s)) {
        skew = 1;
    }

    wnaf[0] = secp256k1_scalar_get_bits_var(work, 0, w) + skew;
    /* Compute last window size. Relevant when window size doesn't divide the
     * number of bits in the scalar */
    last_w = WNAF_BITS - (WNAF_SIZE(w) - 1) * w;

    /* Store the position of the first nonzero word in max_pos to allow
     * skipping leading zeros when calculating the wnaf. */
    for (pos = WNAF_SIZE(w) - 1; pos > 0; pos--) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if(val != 0) {
            break;
        }
        wnaf[pos] = 0;
    }
    max_pos = pos;
    pos = 1;

    while (pos <= max_pos) {
        int val = secp256k1_scalar_get_bits_var(work, pos * w, pos == WNAF_SIZE(w)-1 ? last_w : w);
        if ((val & 1) == 0) {
            wnaf[pos - 1] -= (1 << w);
            wnaf[pos] = (val + 1);
        } else {
            wnaf[pos] = val;
        }
        /* Set a coefficient to zero if it is 1 or -1 and the proceeding digit
         * is strictly negative or strictly positive respectively. Only change
         * coefficients at previous positions because above code assumes that
         * wnaf[pos - 1] is odd.
         */
        if (pos >= 2 && ((wnaf[pos - 1] == 1 && wnaf[pos - 2] < 0) || (wnaf[pos - 1] == -1 && wnaf[pos - 2] > 0))) {
            if (wnaf[pos - 1] == 1) {
                wnaf[pos - 2] += 1 << w;
            } else {
                wnaf[pos - 2] -= 1 << w;
            }
            wnaf[pos - 1] = 0;
        }
        ++pos;
    }

    return skew;
}